

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::SolveSOR
          (TPZSkylMatrix<double> *this,int64_t *numiterations,TPZFMatrix<double> *F,
          TPZFMatrix<double> *result,TPZFMatrix<double> *residual,TPZFMatrix<double> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  double dVar2;
  double **ppdVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long col;
  long lVar14;
  double dVar15;
  double local_c8;
  
  if (residual != F) {
    if (residual == (TPZFMatrix<double> *)0x0) {
      local_c8 = *tol + *tol + 1.0;
    }
    else {
      local_c8 = Norm(residual);
    }
    if (FromCurrent == 0) {
      (*(result->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf]
      )();
    }
    iVar5 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])();
    lVar9 = (F->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    lVar13 = CONCAT44(extraout_var,iVar5) + -1;
    lVar11 = 0;
    lVar4 = lVar11;
    if (direction != -1) {
      lVar13 = lVar11;
      lVar4 = CONCAT44(extraout_var,iVar5);
    }
    if (lVar9 < 1) {
      lVar9 = lVar11;
    }
    lVar1 = (ulong)(direction != -1) * 2 + -1;
    while ((lVar11 < *numiterations && (*tol <= local_c8 && local_c8 != *tol))) {
      TPZFMatrix<double>::operator=(scratch,F);
      local_c8 = 0.0;
      for (col = 0; col != lVar9; col = col + 1) {
        lVar14 = lVar13;
        if (direction == 1) {
          for (; lVar12 = lVar13, lVar14 != lVar4; lVar14 = lVar14 + lVar1) {
            ppdVar3 = (this->fElem).fStore;
            pdVar8 = ppdVar3[lVar14];
            lVar12 = (long)ppdVar3[lVar14 + 1] - (long)pdVar8;
            pdVar6 = TPZFMatrix<double>::operator()(scratch,(lVar14 - (lVar12 >> 3)) + 1,col);
            pdVar7 = TPZFMatrix<double>::operator()(result,lVar14,col);
            dVar15 = *pdVar7;
            pdVar7 = (double *)((long)(this->fElem).fStore[lVar14] + lVar12 + -8);
            lVar12 = (long)pdVar7 - (long)pdVar8 >> 3;
            if (lVar12 < 0) {
              lVar12 = -1;
            }
            for (lVar10 = 0; lVar12 + 1 != lVar10; lVar10 = lVar10 + 1) {
              pdVar6[lVar10] = pdVar6[lVar10] - *pdVar7 * dVar15;
              pdVar7 = pdVar7 + -1;
            }
          }
          for (; lVar12 != lVar4; lVar12 = lVar12 + lVar1) {
            ppdVar3 = (this->fElem).fStore;
            lVar14 = (long)ppdVar3[lVar12 + 1] - (long)ppdVar3[lVar12];
            pdVar8 = TPZFMatrix<double>::operator()(scratch,lVar12,col);
            dVar15 = *pdVar8;
            pdVar7 = TPZFMatrix<double>::operator()(result,(lVar12 - (lVar14 >> 3)) + 1,col);
            pdVar6 = (this->fElem).fStore[lVar12];
            pdVar8 = (double *)((long)pdVar6 + lVar14);
            while (pdVar8 = pdVar8 + -1, pdVar6 < pdVar8) {
              dVar2 = *pdVar7;
              pdVar7 = pdVar7 + 1;
              dVar15 = dVar15 - *pdVar8 * dVar2;
            }
            local_c8 = local_c8 + ABS(dVar15 * dVar15);
            dVar2 = *pdVar8;
            pdVar8 = TPZFMatrix<double>::operator()(result,lVar12,col);
            *pdVar8 = (dVar15 * overrelax) / dVar2 + *pdVar8;
          }
        }
        else {
          for (; lVar12 = lVar13, lVar14 != lVar4; lVar14 = lVar14 + lVar1) {
            ppdVar3 = (this->fElem).fStore;
            lVar12 = (long)ppdVar3[lVar14 + 1] - (long)ppdVar3[lVar14];
            pdVar8 = TPZFMatrix<double>::operator()(scratch,lVar14,col);
            dVar15 = *pdVar8;
            pdVar7 = TPZFMatrix<double>::operator()(result,(lVar14 - (lVar12 >> 3)) + 1,col);
            pdVar6 = (this->fElem).fStore[lVar14];
            pdVar8 = (double *)((long)pdVar6 + lVar12);
            while (pdVar8 = pdVar8 + -1, pdVar6 < pdVar8) {
              dVar2 = *pdVar7;
              pdVar7 = pdVar7 + 1;
              dVar15 = dVar15 - *pdVar8 * dVar2;
            }
            pdVar8 = TPZFMatrix<double>::operator()(scratch,lVar14,col);
            *pdVar8 = dVar15;
          }
          for (; lVar12 != lVar4; lVar12 = lVar12 + lVar1) {
            ppdVar3 = (this->fElem).fStore;
            pdVar8 = ppdVar3[lVar12];
            lVar14 = (long)ppdVar3[lVar12 + 1] - (long)pdVar8;
            pdVar6 = TPZFMatrix<double>::operator()(scratch,(lVar12 - (lVar14 >> 3)) + 1,col);
            pdVar7 = TPZFMatrix<double>::operator()(scratch,lVar12,col);
            dVar15 = *pdVar7;
            dVar2 = *pdVar8;
            pdVar7 = TPZFMatrix<double>::operator()(result,lVar12,col);
            dVar15 = dVar15 - dVar2 * *pdVar7;
            dVar2 = *pdVar8;
            pdVar7 = TPZFMatrix<double>::operator()(result,lVar12,col);
            *pdVar7 = (dVar15 * overrelax) / dVar2 + *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()(result,lVar12,col);
            dVar2 = *pdVar7;
            pdVar7 = (double *)((long)(this->fElem).fStore[lVar12] + lVar14);
            while (pdVar7 = pdVar7 + -1, pdVar8 < pdVar7) {
              *pdVar6 = *pdVar6 - *pdVar7 * dVar2;
              pdVar6 = pdVar6 + 1;
            }
            local_c8 = local_c8 + ABS(dVar15 * dVar15);
          }
        }
      }
      if (local_c8 < 0.0) {
        local_c8 = sqrt(local_c8);
      }
      else {
        local_c8 = SQRT(local_c8);
      }
      lVar11 = lVar11 + 1;
    }
    if (residual != (TPZFMatrix<double> *)0x0) {
      (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x28])
                (this,result,F);
    }
    *numiterations = lVar11;
    *tol = local_c8;
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}